

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::mouseMoveEvent(QScrollBar *this,QMouseEvent *e)

{
  byte bVar1;
  Int IVar2;
  int iVar3;
  int iVar4;
  Int IVar5;
  enum_type f1;
  QScrollBarPrivate *pQVar6;
  QStyle *pQVar7;
  QScrollBarPrivate *pQVar8;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  SubControl newSc;
  int m;
  int newPosition;
  QScrollBarPrivate *d;
  QRect pr;
  QRect scRect;
  QRect r;
  QPoint click;
  QStyleOptionSlider opt;
  undefined4 in_stack_fffffffffffffe48;
  QFlagsStorage<QStyle::SubControl> in_stack_fffffffffffffe4c;
  enum_type in_stack_fffffffffffffe50;
  enum_type in_stack_fffffffffffffe54;
  QWidget *in_stack_fffffffffffffe58;
  SliderAction action;
  undefined4 in_stack_fffffffffffffe60;
  SubControl in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 uVar10;
  QPoint local_134;
  undefined1 local_12c [16];
  undefined1 local_11c [16];
  undefined1 local_10c [16];
  QFlagsStorageHelper<QStyle::SubControl,_4> local_fc;
  QPointF local_f8;
  QPoint local_e4;
  QFlagsStorageHelper<QStyle::SubControl,_4> local_dc;
  QPointF local_d8;
  QPoint local_c8;
  undefined1 local_c0 [16];
  QPointF local_b0;
  QPoint local_a0;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_98;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_94;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_90;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_8c;
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QScrollBar *)0x67d785);
  if (pQVar6->pressedControl == SC_None) goto LAB_0067de60;
  memcpy(local_88,&DAT_00b223d8,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x67d7c3);
  (**(code **)(*in_RDI + 0x1a8))(in_RDI,local_88);
  local_90.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QSinglePointEvent::buttons
                 ((QSinglePointEvent *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                 );
  local_8c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)
                  CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                  in_stack_fffffffffffffe4c.i);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
  uVar10 = true;
  if (IVar2 == 0) {
    local_98.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons
                   ((QSinglePointEvent *)
                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    local_94.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QFlags<Qt::MouseButton>::operator&
                   ((QFlags<Qt::MouseButton> *)
                    CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                    in_stack_fffffffffffffe4c.i);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_94);
    in_stack_fffffffffffffe7e = false;
    uVar10 = in_stack_fffffffffffffe7e;
    if (IVar2 != 0) {
      pQVar7 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
      iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,2,local_88,in_RDI,0);
      in_stack_fffffffffffffe7e = iVar3 != 0;
      uVar10 = in_stack_fffffffffffffe7e;
    }
  }
  if (((uVar10 ^ 0xff) & 1) == 0) {
    if (pQVar6->pressedControl == SC_ScrollBarSlider) {
      local_a0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_b0 = QSinglePointEvent::position((QSinglePointEvent *)0x67d8e6);
      local_a0 = QPointF::toPoint((QPointF *)
                                  CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      pQVar8 = d_func((QScrollBar *)0x67d921);
      iVar3 = (int)((ulong)pQVar6 >> 0x20);
      if ((pQVar8->super_QAbstractSliderPrivate).orientation == Horizontal) {
        iVar4 = QPoint::x((QPoint *)0x67d937);
      }
      else {
        iVar4 = QPoint::y((QPoint *)0x67d94a);
      }
      QScrollBarPrivate::pixelPosToRangeValue
                ((QScrollBarPrivate *)
                 CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 iVar3);
      pQVar7 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
      iVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,8,local_88,in_RDI);
      if (-1 < iVar3) {
        local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = (undefined1  [16])
                   QWidget::rect((QWidget *)CONCAT44(iVar4,in_stack_fffffffffffffe68));
        QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58
                      ,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
        local_d8 = QSinglePointEvent::position((QSinglePointEvent *)0x67da06);
        local_c8 = QPointF::toPoint((QPointF *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        QRect::contains((QPoint *)local_c0,SUB81(&local_c8,0));
      }
      QAbstractSlider::setSliderPosition
                ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    }
    else {
      pQVar7 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
      iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,3,local_88,in_RDI,0);
      if (iVar3 == 0) {
        pQVar7 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
        iVar3 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x3f,local_88,in_RDI,0);
        bVar9 = false;
        if (iVar3 != 0) {
          in_stack_fffffffffffffe64 = pQVar6->pressedControl;
          ::operator|(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          local_dc.super_QFlagsStorage<QStyle::SubControl>.i =
               (QFlagsStorage<QStyle::SubControl>)
               ::operator&(SC_None,(QFlags<QStyle::SubControl>)in_stack_fffffffffffffe4c.i);
          IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_dc);
          bVar9 = IVar5 != 0;
        }
        if (bVar9) {
          in_stack_fffffffffffffe58 =
               (QWidget *)
               QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
          local_f8 = QSinglePointEvent::position((QSinglePointEvent *)0x67db4f);
          local_e4 = QPointF::toPoint((QPointF *)
                                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))
          ;
          f1 = (**(code **)(*(long *)in_stack_fffffffffffffe58 + 0xd0))
                         (in_stack_fffffffffffffe58,2,local_88,&local_e4,in_RDI);
          if ((f1 != pQVar6->pressedControl) || ((pQVar6->pointerOutsidePressedControl & 1U) != 0))
          {
            in_stack_fffffffffffffe54 = f1;
            ::operator|(f1,in_stack_fffffffffffffe50);
            local_fc.super_QFlagsStorage<QStyle::SubControl>.i =
                 (QFlagsStorage<QStyle::SubControl>)
                 ::operator&(SC_None,(QFlags<QStyle::SubControl>)in_stack_fffffffffffffe4c.i);
            IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_fc);
            if (IVar5 == 0) goto LAB_0067dd18;
            pQVar6->pointerOutsidePressedControl = false;
            local_10c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_10c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQVar7 = QWidget::style((QWidget *)
                                    CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48))
            ;
            local_10c = (**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,2,local_88,f1,in_RDI);
            pQVar7 = QWidget::style((QWidget *)
                                    CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48))
            ;
            local_11c = (**(code **)(*(long *)pQVar7 + 0xd8))
                                  (pQVar7,2,local_88,pQVar6->pressedControl,in_RDI);
            QRect::operator|=((QRect *)in_stack_fffffffffffffe58,
                              (QRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                             );
            pQVar6->pressedControl = f1;
            QScrollBarPrivate::activateControl
                      ((QScrollBarPrivate *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                       (int)in_stack_fffffffffffffe58);
            QWidget::update(in_stack_fffffffffffffe58,
                            (QRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          }
        }
        else {
LAB_0067dd18:
          local_12c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_12c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar7 = QWidget::style((QWidget *)
                                  CONCAT44(in_stack_fffffffffffffe4c.i,in_stack_fffffffffffffe48));
          local_12c = (**(code **)(*(long *)pQVar7 + 0xd8))
                                (pQVar7,2,local_88,pQVar6->pressedControl,in_RDI);
          QSinglePointEvent::position((QSinglePointEvent *)0x67dd83);
          local_134 = QPointF::toPoint((QPointF *)
                                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                                      );
          bVar1 = QRect::contains((QPoint *)local_12c,SUB81(&local_134,0));
          if ((bVar1 & 1) == (pQVar6->pointerOutsidePressedControl & 1U)) {
            bVar1 = pQVar6->pointerOutsidePressedControl ^ 0xff;
            pQVar6->pointerOutsidePressedControl = (bool)(bVar1 & 1);
            action = (SliderAction)((ulong)in_stack_fffffffffffffe58 >> 0x20);
            if ((bVar1 & 1) == 0) {
              QScrollBarPrivate::activateControl
                        ((QScrollBarPrivate *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),action,
                         (int)in_stack_fffffffffffffe58);
            }
            else {
              pQVar6->pointerOutsidePressedControl = true;
              QAbstractSlider::setRepeatAction
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),action,
                         (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
              QWidget::repaint(in_stack_fffffffffffffe58,
                               (QRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50
                                                ));
            }
          }
        }
      }
    }
  }
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x67de60);
LAB_0067de60:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);
    if (!d->pressedControl)
        return;

    QStyleOptionSlider opt;
    initStyleOption(&opt);
    if (!(e->buttons() & Qt::LeftButton
          ||  ((e->buttons() & Qt::MiddleButton)
               && style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition, &opt, this))))
        return;

    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        QPoint click = e->position().toPoint();
        int newPosition = d->pixelPosToRangeValue((HORIZONTAL ? click.x() : click.y()) -d->clickOffset);
        int m = style()->pixelMetric(QStyle::PM_MaximumDragDistance, &opt, this);
        if (m >= 0) {
            QRect r = rect();
            r.adjust(-m, -m, m, m);
            if (! r.contains(e->position().toPoint()))
                newPosition = d->snapBackPosition;
        }
        setSliderPosition(newPosition);
    } else if (!style()->styleHint(QStyle::SH_ScrollBar_ScrollWhenPointerLeavesControl, &opt, this)) {

        if (style()->styleHint(QStyle::SH_ScrollBar_RollBetweenButtons, &opt, this)
                && d->pressedControl & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
            QStyle::SubControl newSc = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
            if (newSc == d->pressedControl && !d->pointerOutsidePressedControl)
                return; // nothing to do
            if (newSc & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
                d->pointerOutsidePressedControl = false;
                QRect scRect = style()->subControlRect(QStyle::CC_ScrollBar, &opt, newSc, this);
                scRect |= style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
                d->pressedControl = newSc;
                d->activateControl(d->pressedControl, 0);
                update(scRect);
                return;
            }
        }

        // stop scrolling when the mouse pointer leaves a control
        // similar to push buttons
        QRect pr = style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
        if (pr.contains(e->position().toPoint()) == d->pointerOutsidePressedControl) {
            if ((d->pointerOutsidePressedControl = !d->pointerOutsidePressedControl)) {
                d->pointerOutsidePressedControl = true;
                setRepeatAction(SliderNoAction);
                repaint(pr);
            } else  {
                d->activateControl(d->pressedControl);
            }
        }
    }
}